

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O0

Status __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::optimize(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,bool *interrupt)

{
  undefined8 uVar1;
  int iVar2;
  Verbosity VVar3;
  Status SVar4;
  element_type *peVar5;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  Real RVar6;
  Verbosity old_verbosity_2;
  Verbosity old_verbosity_1;
  Verbosity old_verbosity;
  bool *in_stack_00000318;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_00000320;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffff28;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffff30;
  Statistics *in_stack_ffffffffffffff50;
  Verbosity local_7c [3];
  Verbosity local_70;
  Verbosity local_6c;
  Verbosity local_58;
  Verbosity local_54;
  Statistics *in_stack_ffffffffffffffb8;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffffc0;
  
  Statistics::clearSolvingData(in_stack_ffffffffffffff50);
  _invalidateSolution(in_stack_ffffffffffffff30);
  iVar2 = intParam(in_RDI,SOLVEMODE);
  if ((iVar2 == 0) ||
     (((iVar2 = intParam(in_RDI,SOLVEMODE), iVar2 == 1 &&
       (RVar6 = realParam(in_RDI,FEASTOL), 1e-09 <= RVar6)) &&
      (RVar6 = realParam(in_RDI,OPTTOL), 1e-09 <= RVar6)))) {
    tolerances(in_stack_ffffffffffffff28);
    peVar5 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x645303);
    RVar6 = realParam(in_RDI,FEASTOL);
    Tolerances::setFloatingPointFeastol(peVar5,RVar6);
    std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x64532d);
    tolerances(in_stack_ffffffffffffff28);
    peVar5 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x64534e);
    RVar6 = realParam(in_RDI,OPTTOL);
    Tolerances::setFloatingPointOpttol(peVar5,RVar6);
    std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x64537b);
    tolerances(in_stack_ffffffffffffff28);
    peVar5 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x64539c);
    RVar6 = Tolerances::floatingPointFeastol(peVar5);
    uVar1 = SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
            ::Settings::realParam._2024_8_;
    std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x6453c7);
    if (RVar6 < (double)uVar1) {
      if ((in_RDI != (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)0xfffffffffffffff8) &&
         (VVar3 = SPxOut::getVerbosity(&in_RDI->spxout), 0 < (int)VVar3)) {
        local_54 = SPxOut::getVerbosity(&in_RDI->spxout);
        local_58 = WARNING;
        SPxOut::setVerbosity(&in_RDI->spxout,&stack0xffffffffffffffa8);
        soplex::operator<<((SPxOut *)in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
        soplex::operator<<((SPxOut *)in_stack_ffffffffffffff30,(double)in_stack_ffffffffffffff28);
        soplex::operator<<((SPxOut *)in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
        SPxOut::setVerbosity(&in_RDI->spxout,&stack0xffffffffffffffac);
      }
      peVar5 = std::
               __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x645511);
      Tolerances::setFloatingPointFeastol
                (peVar5,(Real)SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              ::Settings::realParam._2024_8_);
    }
    in_stack_ffffffffffffff30 =
         (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)&stack0xffffffffffffff98;
    tolerances(in_stack_ffffffffffffff28);
    peVar5 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x64553f);
    RVar6 = Tolerances::floatingPointOpttol(peVar5);
    in_stack_ffffffffffffff28 =
         (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
            ::Settings::realParam._2032_8_;
    std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x645566);
    if (RVar6 < (double)in_stack_ffffffffffffff28) {
      if ((in_RDI != (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)0xfffffffffffffff8) &&
         (VVar3 = SPxOut::getVerbosity(&in_RDI->spxout), 0 < (int)VVar3)) {
        local_6c = SPxOut::getVerbosity(&in_RDI->spxout);
        local_70 = WARNING;
        SPxOut::setVerbosity(&in_RDI->spxout,&local_70);
        soplex::operator<<((SPxOut *)in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
        soplex::operator<<((SPxOut *)in_stack_ffffffffffffff30,(double)in_stack_ffffffffffffff28);
        soplex::operator<<((SPxOut *)in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
        SPxOut::setVerbosity(&in_RDI->spxout,&local_6c);
      }
      peVar5 = std::
               __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x645654);
      Tolerances::setFloatingPointOpttol
                (peVar5,(Real)SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              ::Settings::realParam._2032_8_);
    }
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::setSolvingForBoosted(&in_RDI->_solver,false);
    _optimize(in_stack_ffffffffffffffc0,(bool *)in_stack_ffffffffffffffb8);
  }
  else {
    iVar2 = intParam(in_RDI,SYNCMODE);
    if (iVar2 == 0) {
      _syncLPRational(in_stack_ffffffffffffff30,SUB81((ulong)in_stack_ffffffffffffff28 >> 0x38,0));
      _optimizeRational(in_stack_00000320,in_stack_00000318);
    }
    else {
      iVar2 = intParam(in_RDI,SYNCMODE);
      if (iVar2 == 2) {
        _optimizeRational(in_stack_00000320,in_stack_00000318);
      }
      else {
        _optimizeRational(in_stack_00000320,in_stack_00000318);
      }
    }
  }
  if ((in_RDI != (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)0xfffffffffffffff8) &&
     (VVar3 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar3)) {
    local_7c[2] = SPxOut::getVerbosity(&in_RDI->spxout);
    local_7c[1] = 3;
    SPxOut::setVerbosity(&in_RDI->spxout,local_7c + 1);
    soplex::operator<<((SPxOut *)in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
    local_7c[0] = INFO1;
    SPxOut::getStream(&in_RDI->spxout,local_7c);
    printShortStatistics(in_stack_ffffffffffffffc0,(ostream *)in_stack_ffffffffffffffb8);
    soplex::operator<<((SPxOut *)in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
    SPxOut::setVerbosity(&in_RDI->spxout,local_7c + 2);
  }
  SVar4 = status(in_RDI);
  return SVar4;
}

Assistant:

typename SPxSolverBase<R>::Status SoPlexBase<R>::optimize(volatile bool* interrupt)
{
   assert(_isConsistent());

   // clear statistics
   _statistics->clearSolvingData();

   // the solution is no longer valid
   _invalidateSolution();

   // decide whether to solve the rational LP with iterative refinement or call the standard floating-point solver
   if(intParam(SoPlexBase<R>::SOLVEMODE) == SOLVEMODE_REAL
         || (intParam(SoPlexBase<R>::SOLVEMODE) == SOLVEMODE_AUTO
             && realParam(SoPlexBase<R>::FEASTOL) >= 1e-9 && realParam(SoPlexBase<R>::OPTTOL) >= 1e-9))
   {
      // the only tolerances used are the ones for the floating-point solver, so set them to the global tolerances
      this->tolerances()->setFloatingPointFeastol(realParam(SoPlexBase<R>::FEASTOL));
      this->tolerances()->setFloatingPointOpttol(realParam(SoPlexBase<R>::OPTTOL));

      // ensure that tolerances are reasonable for the floating-point solver
      // todo: refactor to take into account epsilon value instead
      if(this->tolerances()->floatingPointFeastol() <
            _currentSettings->realParam.lower[SoPlexBase<R>::FPFEASTOL])
      {
         SPX_MSG_WARNING(spxout, spxout <<
                         "Cannot call floating-point solver with feasibility tolerance below "
                         << _currentSettings->realParam.lower[SoPlexBase<R>::FPFEASTOL] << " - relaxing tolerance\n");
         this->_tolerances->setFloatingPointFeastol(
            _currentSettings->realParam.lower[SoPlexBase<R>::FPFEASTOL]);
      }

      if(this->tolerances()->floatingPointOpttol() <
            _currentSettings->realParam.lower[SoPlexBase<R>::FPOPTTOL])
      {
         SPX_MSG_WARNING(spxout, spxout <<
                         "Cannot call floating-point solver with optimality tolerance below "
                         << _currentSettings->realParam.lower[SoPlexBase<R>::FPOPTTOL] << " - relaxing tolerance\n");
         this->_tolerances->setFloatingPointOpttol(
            _currentSettings->realParam.lower[SoPlexBase<R>::FPOPTTOL]);
      }

      _solver.setSolvingForBoosted(false);

      _optimize(interrupt);
#ifdef SOPLEX_DEBUG // this check will remove scaling of the realLP
      _checkBasisScaling();
#endif
   }
   else if(intParam(SoPlexBase<R>::SYNCMODE) == SYNCMODE_ONLYREAL)
   {
      _syncLPRational();
      _optimizeRational(interrupt);
   }
   else if(intParam(SoPlexBase<R>::SYNCMODE) == SYNCMODE_MANUAL)
   {
#ifdef ENABLE_ADDITIONAL_CHECKS
      assert(areLPsInSync(true, true, false));
#else
      assert(areLPsInSync(true, false, false));
#endif

      _optimizeRational(interrupt);

#ifdef ENABLE_ADDITIONAL_CHECKS
      assert(areLPsInSync(true, true, false));
#else
      assert(areLPsInSync(true, false, false));
#endif
   }
   else
   {
#ifdef ENABLE_ADDITIONAL_CHECKS
      assert(areLPsInSync(true, true, false));
#else
      assert(areLPsInSync(true, false, false));
#endif

      _optimizeRational(interrupt);
   }

   SPX_MSG_INFO1(spxout, spxout << "\n";
                 printShortStatistics(spxout.getStream(SPxOut::INFO1));
                 spxout << "\n");


   return status();
}